

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O1

void snga_add_patch_values
               (Integer type,void *alpha,void *beta,Integer ndim,Integer *loC,Integer *hiC,
               Integer *ldC,void *A_ptr,void *B_ptr,void *C_ptr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Integer baseldC [7];
  Integer bunit [7];
  long lStack_e0;
  undefined1 local_d8 [48];
  long local_a8 [8];
  long local_68 [7];
  
  lVar11 = 1;
  if (1 < ndim) {
    lVar12 = 1;
    do {
      lVar11 = lVar11 * ((hiC[lVar12] - loC[lVar12]) + 1);
      lVar12 = lVar12 + 1;
    } while (ndim != lVar12);
  }
  lStack_e0 = 0;
  local_68[0] = 1;
  local_68[1] = 1;
  local_a8[0] = *ldC;
  local_a8[1] = *ldC * ldC[1];
  if (2 < ndim) {
    memset(local_d8,0,ndim * 8 - 0x10);
    lVar13 = 2;
    lVar12 = local_a8[1];
    lVar9 = local_68[1];
    do {
      lVar9 = lVar9 * ((hiC[lVar13 + -1] - loC[lVar13 + -1]) + 1);
      local_68[lVar13] = lVar9;
      lVar12 = lVar12 * ldC[lVar13];
      local_a8[lVar13] = lVar12;
      lVar13 = lVar13 + 1;
    } while (ndim != lVar13);
  }
  switch(type) {
  case 0x3e9:
    if (0 < lVar11) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar14 = 0;
        }
        else {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            if ((lVar13 + 1) % local_68[lVar15 + 1] == 0) {
              *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10 + 1;
            }
            lVar14 = lVar14 + lVar10 * local_a8[lVar15];
            lVar10 = 0;
            if (*(long *)(local_d8 + lVar15 * 8 + -8) <= hiC[lVar15 + 1] - loC[lVar15 + 1]) {
              lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            }
            *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10;
            lVar15 = lVar15 + 1;
          } while (ndim + -1 != lVar15);
        }
        if (lVar9 <= lVar12) {
          lVar15 = 0;
          do {
            *(int *)((long)C_ptr + lVar15 * 4 + lVar14 * 4) =
                 *(int *)((long)B_ptr + lVar15 * 4 + lVar14 * 4) * *beta +
                 *(int *)((long)A_ptr + lVar15 * 4 + lVar14 * 4) * *alpha;
            lVar15 = lVar15 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar15);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11);
    }
    break;
  case 0x3ea:
    if (0 < lVar11) {
      lVar12 = 0;
      do {
        if (ndim < 2) {
          lVar9 = 0;
        }
        else {
          lVar13 = 0;
          lVar9 = 0;
          do {
            lVar14 = *(long *)(local_d8 + lVar13 * 8 + -8);
            if ((lVar12 + 1) % local_68[lVar13 + 1] == 0) {
              *(long *)(local_d8 + lVar13 * 8 + -8) = lVar14 + 1;
            }
            lVar9 = lVar9 + lVar14 * local_a8[lVar13];
            lVar14 = 0;
            if (*(long *)(local_d8 + lVar13 * 8 + -8) <= hiC[lVar13 + 1] - loC[lVar13 + 1]) {
              lVar14 = *(long *)(local_d8 + lVar13 * 8 + -8);
            }
            *(long *)(local_d8 + lVar13 * 8 + -8) = lVar14;
            lVar13 = lVar13 + 1;
          } while (ndim + -1 != lVar13);
        }
        if (*loC <= *hiC) {
          lVar13 = -1;
          do {
            *(long *)((long)C_ptr + lVar13 * 8 + lVar9 * 8 + 8) =
                 *(long *)((long)B_ptr + lVar13 * 8 + lVar9 * 8 + 8) * *beta +
                 *(long *)((long)A_ptr + lVar13 * 8 + lVar9 * 8 + 8) * *alpha;
            lVar13 = lVar13 + 1;
          } while (lVar13 < *hiC - *loC);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar11);
    }
    break;
  case 0x3eb:
    if (0 < lVar11) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar14 = 0;
        }
        else {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            if ((lVar13 + 1) % local_68[lVar15 + 1] == 0) {
              *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10 + 1;
            }
            lVar14 = lVar14 + lVar10 * local_a8[lVar15];
            lVar10 = 0;
            if (*(long *)(local_d8 + lVar15 * 8 + -8) <= hiC[lVar15 + 1] - loC[lVar15 + 1]) {
              lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            }
            *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10;
            lVar15 = lVar15 + 1;
          } while (ndim + -1 != lVar15);
        }
        if (lVar9 <= lVar12) {
          lVar15 = 0;
          do {
            *(float *)((long)C_ptr + lVar15 * 4 + lVar14 * 4) =
                 *alpha * *(float *)((long)A_ptr + lVar15 * 4 + lVar14 * 4) +
                 *beta * *(float *)((long)B_ptr + lVar15 * 4 + lVar14 * 4);
            lVar15 = lVar15 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar15);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11);
    }
    break;
  case 0x3ec:
    if (0 < lVar11) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar14 = 0;
        }
        else {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            if ((lVar13 + 1) % local_68[lVar15 + 1] == 0) {
              *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10 + 1;
            }
            lVar14 = lVar14 + lVar10 * local_a8[lVar15];
            lVar10 = 0;
            if (*(long *)(local_d8 + lVar15 * 8 + -8) <= hiC[lVar15 + 1] - loC[lVar15 + 1]) {
              lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            }
            *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10;
            lVar15 = lVar15 + 1;
          } while (ndim + -1 != lVar15);
        }
        if (lVar9 <= lVar12) {
          lVar15 = 0;
          do {
            *(double *)((long)C_ptr + lVar15 * 8 + lVar14 * 8) =
                 *alpha * *(double *)((long)A_ptr + lVar15 * 8 + lVar14 * 8) +
                 *beta * *(double *)((long)B_ptr + lVar15 * 8 + lVar14 * 8);
            lVar15 = lVar15 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar15);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11);
    }
    break;
  default:
    pnga_error(" wrong data type ",type);
    return;
  case 0x3ee:
    if (0 < lVar11) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar14 = 0;
        }
        else {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            if ((lVar13 + 1) % local_68[lVar15 + 1] == 0) {
              *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10 + 1;
            }
            lVar14 = lVar14 + lVar10 * local_a8[lVar15];
            lVar10 = 0;
            if (*(long *)(local_d8 + lVar15 * 8 + -8) <= hiC[lVar15 + 1] - loC[lVar15 + 1]) {
              lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            }
            *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10;
            lVar15 = lVar15 + 1;
          } while (ndim + -1 != lVar15);
        }
        if (lVar9 <= lVar12) {
          lVar15 = 0;
          do {
            uVar1 = *(undefined8 *)((long)A_ptr + lVar15 * 8 + lVar14 * 8);
            uVar2 = *(undefined8 *)((long)B_ptr + lVar15 * 8 + lVar14 * 8);
            fVar16 = (float)uVar1;
            fVar17 = (float)((ulong)uVar1 >> 0x20);
            fVar18 = (float)uVar2;
            fVar19 = (float)((ulong)uVar2 >> 0x20);
            *(ulong *)((long)C_ptr + lVar15 * 8 + lVar14 * 8) =
                 CONCAT44(*(float *)((long)beta + 4) * fVar18 +
                          *beta * fVar19 + *alpha * fVar17 + fVar16 * *(float *)((long)alpha + 4),
                          -*(float *)((long)beta + 4) * fVar19 +
                          *beta * fVar18 + *alpha * fVar16 + fVar17 * -*(float *)((long)alpha + 4));
            lVar15 = lVar15 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar15);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11);
    }
    break;
  case 0x3ef:
    if (0 < lVar11) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar14 = 0;
        }
        else {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            if ((lVar13 + 1) % local_68[lVar15 + 1] == 0) {
              *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10 + 1;
            }
            lVar14 = lVar14 + lVar10 * local_a8[lVar15];
            lVar10 = 0;
            if (*(long *)(local_d8 + lVar15 * 8 + -8) <= hiC[lVar15 + 1] - loC[lVar15 + 1]) {
              lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            }
            *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10;
            lVar15 = lVar15 + 1;
          } while (ndim + -1 != lVar15);
        }
        if (lVar9 <= lVar12) {
          lVar14 = lVar14 << 4;
          lVar15 = (lVar12 - lVar9) + 1;
          do {
            dVar5 = *(double *)((long)A_ptr + lVar14);
            dVar6 = ((double *)((long)A_ptr + lVar14))[1];
            dVar7 = *(double *)((long)B_ptr + lVar14);
            dVar8 = ((double *)((long)B_ptr + lVar14))[1];
            dVar4 = *(double *)((long)beta + 8) * dVar7 +
                    *beta * dVar8 + *alpha * dVar6 + dVar5 * *(double *)((long)alpha + 8);
            auVar3._8_4_ = SUB84(dVar4,0);
            auVar3._0_8_ = -*(double *)((long)beta + 8) * dVar8 +
                           *beta * dVar7 + *alpha * dVar5 + dVar6 * -*(double *)((long)alpha + 8);
            auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
            *(undefined1 (*) [16])((long)C_ptr + lVar14) = auVar3;
            lVar14 = lVar14 + 0x10;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11);
    }
    break;
  case 0x3f8:
    if (0 < lVar11) {
      lVar12 = *hiC;
      lVar9 = *loC;
      lVar13 = 0;
      do {
        if (ndim < 2) {
          lVar14 = 0;
        }
        else {
          lVar15 = 0;
          lVar14 = 0;
          do {
            lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            if ((lVar13 + 1) % local_68[lVar15 + 1] == 0) {
              *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10 + 1;
            }
            lVar14 = lVar14 + lVar10 * local_a8[lVar15];
            lVar10 = 0;
            if (*(long *)(local_d8 + lVar15 * 8 + -8) <= hiC[lVar15 + 1] - loC[lVar15 + 1]) {
              lVar10 = *(long *)(local_d8 + lVar15 * 8 + -8);
            }
            *(long *)(local_d8 + lVar15 * 8 + -8) = lVar10;
            lVar15 = lVar15 + 1;
          } while (ndim + -1 != lVar15);
        }
        if (lVar9 <= lVar12) {
          lVar15 = 0;
          do {
            *(long *)((long)C_ptr + lVar15 * 8 + lVar14 * 8) =
                 *(long *)((long)B_ptr + lVar15 * 8 + lVar14 * 8) * *beta +
                 *(long *)((long)A_ptr + lVar15 * 8 + lVar14 * 8) * *alpha;
            lVar15 = lVar15 + 1;
          } while ((lVar12 - lVar9) + 1 != lVar15);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar11);
    }
  }
  return;
}

Assistant:

static void snga_add_patch_values(Integer type, void* alpha, void *beta,
                           Integer ndim, Integer *loC, Integer *hiC, Integer *ldC,
                           void *A_ptr, void *B_ptr, void *C_ptr)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldC[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;
  /* compute "local" add */

  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiC[i] - loC[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseldC[0] = ldC[0]; baseldC[1] = baseldC[0] *ldC[1];
  for(i=2; i<ndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiC[i-1] - loC[i-1] + 1);
    baseldC[i] = baseldC[i-1] * ldC[i];
  }

  switch(type){
    case C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((double*)C_ptr)[idx+j] =
            *(double*)alpha *
            ((double*)A_ptr)[idx+j] +
            *(double*)beta *
            ((double*)B_ptr)[idx+j];
      }
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          DoubleComplex a = ((DoubleComplex *)A_ptr)[idx+j];
          DoubleComplex b = ((DoubleComplex *)B_ptr)[idx+j];
          DoubleComplex x= *(DoubleComplex*)alpha;
          DoubleComplex y= *(DoubleComplex*)beta;
          ((DoubleComplex *)C_ptr)[idx+j].real = x.real*a.real -
            x.imag*a.imag + y.real*b.real - y.imag*b.imag;
          ((DoubleComplex *)C_ptr)[idx+j].imag = x.real*a.imag +
            x.imag*a.real + y.real*b.imag + y.imag*b.real;
        }
      }
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          SingleComplex a = ((SingleComplex *)A_ptr)[idx+j];
          SingleComplex b = ((SingleComplex *)B_ptr)[idx+j];
          SingleComplex x= *(SingleComplex*)alpha;
          SingleComplex y= *(SingleComplex*)beta;
          ((SingleComplex *)C_ptr)[idx+j].real = x.real*a.real -
            x.imag*a.imag + y.real*b.real - y.imag*b.imag;
          ((SingleComplex *)C_ptr)[idx+j].imag = x.real*a.imag +
            x.imag*a.real + y.real*b.imag + y.imag*b.real;
        }
      }
      break;
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((int*)C_ptr)[idx+j] = *(int *)alpha *
            ((int*)A_ptr)[idx+j] + *(int*)beta *
            ((int*)B_ptr)[idx+j];
      }
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((float *)C_ptr)[idx+j] = *(float *)alpha *
            ((float *)A_ptr)[idx+j] + *(float *)beta *
            ((float *)B_ptr)[idx+j];
      }
      break;
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long *)C_ptr)[idx+j] = *(long *)alpha *
            ((long *)A_ptr)[idx+j] + *(long *)beta *
            ((long *)B_ptr)[idx+j];
      }
      break;
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long long*)C_ptr)[idx+j] = *(long long*)alpha *
            ((long long*)A_ptr)[idx+j] + *(long long*)beta *
            ((long long*)B_ptr)[idx+j];
      }
      break;
    default: pnga_error(" wrong data type ",type);
  }
}